

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_or_8_re_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint res;
  uint ea;
  
  uVar1 = m68ki_read_imm_16();
  uVar3 = m68ki_cpu.dar[m68ki_cpu.ir >> 9 & 7];
  uVar2 = m68ki_read_8_fc((int)(short)uVar1,m68ki_cpu.s_flag | m68ki_address_space);
  uVar3 = (uVar3 | uVar2) & 0xff;
  m68ki_write_8_fc((int)(short)uVar1,m68ki_cpu.s_flag | 1,uVar3);
  m68ki_cpu.n_flag = uVar3;
  m68ki_cpu.not_z_flag = uVar3;
  m68ki_cpu.c_flag = 0;
  m68ki_cpu.v_flag = 0;
  return;
}

Assistant:

static void m68k_op_or_8_re_aw(void)
{
	uint ea = EA_AW_8();
	uint res = MASK_OUT_ABOVE_8(DX | m68ki_read_8(ea));

	m68ki_write_8(ea, res);

	FLAG_N = NFLAG_8(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
}